

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O3

void SRCTools::SincResampler::Utils::computeResampleFactors
               (uint *upsampleFactor,double *downsampleFactor,double inputFrequency,
               double outputFrequency,uint maxUpsampleFactor)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  
  uVar3 = (ulong)outputFrequency;
  uVar7 = (uint)uVar3;
  *upsampleFactor = uVar7;
  if (((double)(uVar3 & 0xffffffff) == outputFrequency) &&
     (!NAN((double)(uVar3 & 0xffffffff)) && !NAN(outputFrequency))) {
    uVar5 = (ulong)inputFrequency;
    dVar9 = (double)(uVar5 & 0xffffffff);
    if ((dVar9 == inputFrequency) && (!NAN(dVar9) && !NAN(inputFrequency))) {
      uVar6 = uVar7;
      if ((int)uVar5 != 0) {
        uVar2 = uVar3 & 0xffffffff;
        uVar4 = uVar5 & 0xffffffff;
        do {
          uVar6 = (uint)uVar4;
          uVar1 = uVar2 % uVar4;
          uVar2 = uVar4;
          uVar4 = uVar1;
        } while ((int)uVar1 != 0);
      }
      if (1 < uVar6) {
        uVar7 = (uint)((uVar3 & 0xffffffff) / (ulong)uVar6);
        *upsampleFactor = uVar7;
        dVar9 = (double)(int)((uVar5 & 0xffffffff) / (ulong)uVar6);
      }
      *downsampleFactor = dVar9;
      if (uVar7 <= maxUpsampleFactor) {
        return;
      }
      goto LAB_00184c74;
    }
  }
  if (maxUpsampleFactor != 0) {
    uVar7 = 1;
    do {
      dVar9 = (double)uVar7 * (inputFrequency / outputFrequency);
      dVar8 = floor(dVar9 * 1e+15 + 0.5);
      dVar9 = floor(dVar9 + 0.5);
      if ((dVar8 == dVar9 * 1e+15) && (!NAN(dVar8) && !NAN(dVar9 * 1e+15))) {
        *upsampleFactor = uVar7;
        goto LAB_00184c91;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 <= maxUpsampleFactor);
  }
LAB_00184c74:
  *upsampleFactor = maxUpsampleFactor;
  dVar9 = ((double)maxUpsampleFactor * inputFrequency) / outputFrequency;
LAB_00184c91:
  *downsampleFactor = dVar9;
  return;
}

Assistant:

void Utils::computeResampleFactors(unsigned int &upsampleFactor, double &downsampleFactor, const double inputFrequency, const double outputFrequency, const unsigned int maxUpsampleFactor) {
	static const double RATIONAL_RATIO_ACCURACY_FACTOR = 1E15;

	upsampleFactor = static_cast<unsigned int>(outputFrequency);
	unsigned int downsampleFactorInt = static_cast<unsigned int>(inputFrequency);
	if ((upsampleFactor == outputFrequency) && (downsampleFactorInt == inputFrequency)) {
		// Input and output frequencies are integers, try to reduce them
		const unsigned int gcd = greatestCommonDivisor(upsampleFactor, downsampleFactorInt);
		if (gcd > 1) {
			upsampleFactor /= gcd;
			downsampleFactor = downsampleFactorInt / gcd;
		} else {
			downsampleFactor = downsampleFactorInt;
		}
		if (upsampleFactor <= maxUpsampleFactor) return;
	} else {
		// Try to recover rational resample ratio by brute force
		double inputToOutputRatio = inputFrequency / outputFrequency;
		for (unsigned int i = 1; i <= maxUpsampleFactor; ++i) {
			double testFactor = inputToOutputRatio * i;
			if (floor(RATIONAL_RATIO_ACCURACY_FACTOR * testFactor + 0.5) == RATIONAL_RATIO_ACCURACY_FACTOR * floor(testFactor + 0.5)) {
				// inputToOutputRatio found to be rational within the accuracy
				upsampleFactor = i;
				downsampleFactor = floor(testFactor + 0.5);
				return;
			}
		}
	}
	// Use interpolation of FIR taps as the last resort
	upsampleFactor = maxUpsampleFactor;
	downsampleFactor = maxUpsampleFactor * inputFrequency / outputFrequency;
}